

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyCleanHead(TidyDocImpl *doc)

{
  Node *pNVar1;
  Node *element;
  uint local_2c;
  uint titles;
  Node *next;
  Node *node;
  Node *head;
  TidyDocImpl *doc_local;
  
  local_2c = 0;
  if (((int)(doc->config).value[6].v != 1) &&
     (element = prvTidyFindHEAD(doc), element != (Node *)0x0)) {
    pNVar1 = element->content;
    while (next = pNVar1, next != (Node *)0x0) {
      pNVar1 = next->next;
      if ((((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) && (next->tag->id == TidyTag_TITLE)
          ) && (local_2c = local_2c + 1, 1 < local_2c)) {
        prvTidyReport(doc,element,next,0x235);
        prvTidyDiscardElement(doc,next);
      }
    }
  }
  return;
}

Assistant:

void TY_(CleanHead)(TidyDocImpl* doc)
{
    Node *head, *node, *next;
    uint titles = 0;
    if (cfgAutoBool(doc, TidyBodyOnly) == TidyYesState)
        return; /* not going to show head, so forget it */
    head = TY_(FindHEAD)(doc);
    if (!head)
        return;
    node = head->content;
    while (node)
    {
        next = node->next;  /* get any 'next' */
        if (nodeIsTITLE(node))
        {
            titles++;
            if (titles > 1)
            {
                TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, node); /* delete this node */
            }
        }
        node = next;
    }
}